

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

GType greetable_get_type(void)

{
  int iVar1;
  undefined8 uVar2;
  
  if ((greetable_get_type::static_g_define_type_id == 0) &&
     (iVar1 = g_once_init_enter(&greetable_get_type::static_g_define_type_id), iVar1 != 0)) {
    uVar2 = g_intern_static_string("Greetable");
    uVar2 = g_type_register_static_simple(8,uVar2,0x28,greetable_default_init,0,0,0);
    g_type_interface_add_prerequisite(uVar2,0x50);
    g_once_init_leave(&greetable_get_type::static_g_define_type_id,uVar2);
  }
  return greetable_get_type::static_g_define_type_id;
}

Assistant:

static void
greetable_default_init (GreetableIface *iface)
{
  /* GObject signals for incoming D-Bus method calls: */
  /**
   * Greetable::handle-greet:
   * @object: A #Greetable.
   * @invocation: A #GDBusMethodInvocation.
   * @arg_recipient: Argument passed by remote caller.
   *
   * Signal emitted when a remote caller is invoking the <link linkend="gdbus-method-io-mangoh-Testing-Greetable.Greet">Greet()</link> D-Bus method.
   *
   * If a signal handler returns %TRUE, it means the signal handler will handle the invocation (e.g. take a reference to @invocation and eventually call greetable_complete_greet() or e.g. g_dbus_method_invocation_return_error() on it) and no other signal handlers will run. If no signal handler handles the invocation, the %G_DBUS_ERROR_UNKNOWN_METHOD error is returned.
   *
   * Returns: %G_DBUS_METHOD_INVOCATION_HANDLED or %TRUE if the invocation was handled, %G_DBUS_METHOD_INVOCATION_UNHANDLED or %FALSE to let other signal handlers run.
   */
  g_signal_new ("handle-greet",
    G_TYPE_FROM_INTERFACE (iface),
    G_SIGNAL_RUN_LAST,
    G_STRUCT_OFFSET (GreetableIface, handle_greet),
    g_signal_accumulator_true_handled,
    NULL,
    g_cclosure_marshal_generic,
    G_TYPE_BOOLEAN,
    2,
    G_TYPE_DBUS_METHOD_INVOCATION, G_TYPE_STRING);

  /* GObject signals for received D-Bus signals: */
  /**
   * Greetable::timer-expired:
   * @object: A #Greetable.
   * @arg_remaining: Argument.
   *
   * On the client-side, this signal is emitted whenever the D-Bus signal <link linkend="gdbus-signal-io-mangoh-Testing-Greetable.TimerExpired">"TimerExpired"</link> is received.
   *
   * On the service-side, this signal can be used with e.g. g_signal_emit_by_name() to make the object emit the D-Bus signal.
   */
  g_signal_new ("timer-expired",
    G_TYPE_FROM_INTERFACE (iface),
    G_SIGNAL_RUN_LAST,
    G_STRUCT_OFFSET (GreetableIface, timer_expired),
    NULL,
    NULL,
    g_cclosure_marshal_generic,
    G_TYPE_NONE,
    1, G_TYPE_UINT);

  /* GObject properties for D-Bus properties: */
  /**
   * Greetable:greeting:
   *
   * Represents the D-Bus property <link linkend="gdbus-property-io-mangoh-Testing-Greetable.Greeting">"Greeting"</link>.
   *
   * Since the D-Bus property for this #GObject property is both readable and writable, it is meaningful to both read from it and write to it on both the service- and client-side.
   */
  g_object_interface_install_property (iface,
    g_param_spec_string ("greeting", "Greeting", "Greeting", NULL, G_PARAM_READWRITE | G_PARAM_STATIC_STRINGS));
}